

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

CacheEntryType cmState::StringToCacheEntryType(char *s)

{
  int iVar1;
  char *__s2;
  long lVar2;
  
  if (cmCacheEntryTypes[0] != (char *)0x0) {
    lVar2 = 0;
    __s2 = cmCacheEntryTypes[0];
    do {
      iVar1 = strcmp(s,__s2);
      if (iVar1 == 0) {
        return (CacheEntryType)lVar2;
      }
      __s2 = cmCacheEntryTypes[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (__s2 != (char *)0x0);
  }
  return STRING;
}

Assistant:

cmState::CacheEntryType
cmState::StringToCacheEntryType(const char* s)
{
  int i = 0;
  while(cmCacheEntryTypes[i])
    {
    if(strcmp(s, cmCacheEntryTypes[i]) == 0)
      {
      return static_cast<cmState::CacheEntryType>(i);
      }
    ++i;
    }
  return STRING;
}